

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

int __thiscall Catch::Generators::GeneratorTracker::close(GeneratorTracker *this,int __fd)

{
  bool bVar1;
  uint uVar2;
  GeneratorUntypedBase *pGVar3;
  bool local_41;
  __normal_iterator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  local_40 [2];
  shared_ptr<Catch::TestCaseTracking::ITracker> *local_30;
  shared_ptr<Catch::TestCaseTracking::ITracker> *local_28;
  __normal_iterator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  local_20;
  bool local_11;
  GeneratorTracker *pGStack_10;
  bool should_wait_for_child;
  GeneratorTracker *this_local;
  GeneratorTracker *pGVar4;
  
  pGStack_10 = this;
  TestCaseTracking::TrackerBase::close(&this->super_TrackerBase,__fd);
  bVar1 = std::
          vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
          ::empty(&(this->super_TrackerBase).super_ITracker.m_children);
  local_41 = false;
  if (!bVar1) {
    local_28 = (shared_ptr<Catch::TestCaseTracking::ITracker> *)
               std::
               vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
               ::begin(&(this->super_TrackerBase).super_ITracker.m_children);
    local_30 = (shared_ptr<Catch::TestCaseTracking::ITracker> *)
               std::
               vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
               ::end(&(this->super_TrackerBase).super_ITracker.m_children);
    local_20 = std::
               find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<Catch::TestCaseTracking::ITracker>*,std::vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>>>>,Catch::Generators::GeneratorTracker::close()::_lambda(std::shared_ptr<Catch::TestCaseTracking::ITracker>)_1_>
                         (local_28,local_30);
    local_40[0]._M_current =
         (shared_ptr<Catch::TestCaseTracking::ITracker> *)
         std::
         vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
         ::end(&(this->super_TrackerBase).super_ITracker.m_children);
    local_41 = __gnu_cxx::operator==(&local_20,local_40);
  }
  local_11 = local_41;
  if (local_41 == false) {
    pGVar4 = this;
    if ((this->super_TrackerBase).m_runState != CompletedSuccessfully) goto LAB_002ecec2;
    pGVar3 = Catch::Detail::unique_ptr<Catch::Generators::GeneratorUntypedBase>::operator->
                       (&this->m_generator);
    uVar2 = (*pGVar3->_vptr_GeneratorUntypedBase[2])();
    pGVar4 = (GeneratorTracker *)(ulong)uVar2;
    if ((uVar2 & 1) == 0) goto LAB_002ecec2;
  }
  std::
  vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
  ::clear(&(this->super_TrackerBase).super_ITracker.m_children);
  (this->super_TrackerBase).m_runState = Executing;
  pGVar4 = this;
LAB_002ecec2:
  return (int)pGVar4;
}

Assistant:

void close() override {
                TrackerBase::close();
                // If a generator has a child (it is followed by a section)
                // and none of its children have started, then we must wait
                // until later to start consuming its values.
                // This catches cases where `GENERATE` is placed between two
                // `SECTION`s.
                // **The check for m_children.empty cannot be removed**.
                // doing so would break `GENERATE` _not_ followed by `SECTION`s.
                const bool should_wait_for_child =
                    !m_children.empty() &&
                    std::find_if(m_children.begin(),
                        m_children.end(),
                        [](TestCaseTracking::ITrackerPtr tracker) {
                            return tracker->hasStarted();
                        }) == m_children.end();

                        // This check is a bit tricky, because m_generator->next()
                        // has a side-effect, where it consumes generator's current
                        // value, but we do not want to invoke the side-effect if
                        // this generator is still waiting for any child to start.
                        if (should_wait_for_child ||
                            (m_runState == CompletedSuccessfully &&
                                m_generator->next())) {
                            m_children.clear();
                            m_runState = Executing;
                        }
            }